

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void * ym3812_init(UINT32 clock,UINT32 rate)

{
  FM_OPL *YM3812;
  UINT32 rate_local;
  UINT32 clock_local;
  
  _rate_local = OPLCreate(clock,rate,1);
  if (_rate_local == (FM_OPL *)0x0) {
    _rate_local = (FM_OPL *)0x0;
  }
  else {
    OPLSetUpdateHandler(_rate_local,ym3812_update_req,_rate_local);
  }
  return _rate_local;
}

Assistant:

void * ym3812_init(UINT32 clock, UINT32 rate)
{
	/* emulator create */
	FM_OPL *YM3812 = OPLCreate(clock,rate,OPL_TYPE_YM3812);
	if (YM3812 == NULL)
		return NULL;
	
	OPLSetUpdateHandler(YM3812, ym3812_update_req, YM3812);
	//ym3812_reset_chip(YM3812);
	return YM3812;
}